

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O2

bool __thiscall de::FilePath::exists(FilePath *this)

{
  int iVar1;
  FilePath normPath;
  stat st;
  char *local_c0 [4];
  stat local_a0;
  
  normalize((FilePath *)local_c0,this);
  iVar1 = stat(local_c0[0],&local_a0);
  std::__cxx11::string::~string((string *)local_c0);
  return iVar1 == 0;
}

Assistant:

bool FilePath::exists (void) const
{
	FilePath	normPath	= FilePath::normalize(*this);
	struct		stat		st;
	int			result		= stat(normPath.getPath(), &st);
	return result == 0;
}